

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O2

int string_to_size(char *string,size_t *numberp)

{
  sbyte sVar1;
  char *in_RAX;
  uintmax_t uVar2;
  int *piVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  sbyte sVar7;
  char *end;
  
  iVar6 = -0x14;
  if (string == (char *)0x0) {
    return -0x14;
  }
  if (*string == '\0') {
    return -0x14;
  }
  if (*string == '-') {
    return -0x14;
  }
  end = in_RAX;
  uVar2 = strtoumax(string,&end,10);
  sVar7 = 0;
  if (end <= string) goto LAB_0015c7b5;
  bVar4 = *end;
  sVar7 = 0;
  uVar5 = (ulong)(bVar4 - 0x47);
  if (bVar4 - 0x47 < 0x27) {
    if ((0x100000001U >> (uVar5 & 0x3f) & 1) == 0) {
      sVar1 = 10;
      if ((0x1000000010U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x4000000040U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_0015c7a3;
        sVar1 = 0x14;
      }
    }
    else {
      sVar1 = 0x1e;
    }
    sVar7 = sVar1;
    end = end + 1;
    bVar4 = *end;
  }
LAB_0015c7a3:
  if ((bVar4 | 0x20) == 0x62) {
    end = end + 1;
  }
LAB_0015c7b5:
  if ((((end != string) && (*end == '\0')) && (piVar3 = __errno_location(), *piVar3 != 0x4b)) &&
     (uVar2 <= 0xffffffffffffffffU >> sVar7)) {
    *numberp = uVar2 << sVar7;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int
string_to_size(const char *string, size_t *numberp)
{
	uintmax_t number;
	char *end;
	unsigned int shift = 0;

	if (string == NULL || *string == '\0' || *string == '-')
		return (ARCHIVE_WARN);
	number = strtoumax(string, &end, 10);
	if (end > string) {
		if (*end == 'K' || *end == 'k') {
			shift = 10;
			end++;
		} else if (*end == 'M' || *end == 'm') {
			shift = 20;
			end++;
		} else if (*end == 'G' || *end == 'g') {
			shift = 30;
			end++;
		}
		if (*end == 'B' || *end == 'b') {
			end++;
		}
	}
	if (end == string || *end != '\0' || errno == EOVERFLOW) {
		return (ARCHIVE_WARN);
	}
	if (number > (uintmax_t)SIZE_MAX >> shift) {
		return (ARCHIVE_WARN);
	}
	*numberp = (size_t)(number << shift);
	return (ARCHIVE_OK);
}